

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void absl::lts_20240722::CheckForMutexCorruption(intptr_t v,char *label)

{
  uint uVar1;
  
  uVar1 = (uint)v;
  if (((uVar1 * 8 ^ 0x20) & uVar1 & 0x28) == 0) {
    return;
  }
  if ((~uVar1 & 9) != 0) {
    if ((uVar1 & 0x24) != 0x20) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x7af,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
    }
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x7ae,
               "Check (v & (kMuWait | kMuWrWait)) != kMuWrWait failed: %s: Mutex corrupt: waiting writer with no waiters: %p"
               ,label);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x7ae,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x7ab,
             "Check (v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader) failed: %s: Mutex corrupt: both reader and writer lock held: %p"
             ,label);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x7ab,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
}

Assistant:

static void CheckForMutexCorruption(intptr_t v, const char* label) {
  // Test for either of two situations that should not occur in v:
  //   kMuWriter and kMuReader
  //   kMuWrWait and !kMuWait
  const uintptr_t w = static_cast<uintptr_t>(v ^ kMuWait);
  // By flipping that bit, we can now test for:
  //   kMuWriter and kMuReader in w
  //   kMuWrWait and kMuWait in w
  // We've chosen these two pairs of values to be so that they will overlap,
  // respectively, when the word is left shifted by three.  This allows us to
  // save a branch in the common (correct) case of them not being coincident.
  static_assert(kMuReader << 3 == kMuWriter, "must match");
  static_assert(kMuWait << 3 == kMuWrWait, "must match");
  if (ABSL_PREDICT_TRUE((w & (w << 3) & (kMuWriter | kMuWrWait)) == 0)) return;
  RAW_CHECK_FMT((v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader),
                "%s: Mutex corrupt: both reader and writer lock held: %p",
                label, reinterpret_cast<void*>(v));
  RAW_CHECK_FMT((v & (kMuWait | kMuWrWait)) != kMuWrWait,
                "%s: Mutex corrupt: waiting writer with no waiters: %p", label,
                reinterpret_cast<void*>(v));
  assert(false);
}